

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O1

quaternion operator*(quaternion *in_quat1,quaternion *in_quat2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  quaternion qVar9;
  
  fVar4 = (in_quat1->field_0).w;
  fVar1 = (in_quat1->field_1).dual.x;
  fVar2 = (in_quat1->field_1).dual.y;
  fVar3 = (in_quat1->field_1).dual.z;
  fVar5 = (in_quat2->field_0).w;
  fVar6 = (in_quat2->field_1).dual.x;
  fVar7 = (in_quat2->field_1).dual.y;
  fVar8 = (in_quat2->field_1).dual.z;
  qVar9.field_1.dual.x = -fVar3 * fVar7 + fVar8 * fVar2 + fVar5 * fVar1 + fVar6 * fVar4;
  qVar9.field_0.w = -fVar3 * fVar8 + fVar7 * -fVar2 + fVar6 * -fVar1 + fVar5 * fVar4;
  qVar9.field_1.dual.z = fVar3 * fVar5 + fVar6 * -fVar2 + fVar7 * fVar1 + fVar8 * fVar4;
  qVar9.field_1.dual.y = fVar3 * fVar6 + fVar5 * fVar2 + fVar8 * -fVar1 + fVar7 * fVar4;
  return qVar9;
}

Assistant:

quaternion operator*(const quaternion &in_quat1, const quaternion &in_quat2) {
    quaternion temp = {0.f};

    temp.w = in_quat1.w * in_quat2.w - in_quat1.q1 * in_quat2.q1 -
             in_quat1.q2 * in_quat2.q2 - in_quat1.q3 * in_quat2.q3;
    temp.q1 = in_quat1.w * in_quat2.q1 + in_quat1.q1 * in_quat2.w +
              in_quat1.q2 * in_quat2.q3 - in_quat1.q3 * in_quat2.q2;
    temp.q2 = in_quat1.w * in_quat2.q2 - in_quat1.q1 * in_quat2.q3 +
              in_quat1.q2 * in_quat2.w + in_quat1.q3 * in_quat2.q1;
    temp.q3 = in_quat1.w * in_quat2.q3 + in_quat1.q1 * in_quat2.q2 -
              in_quat1.q2 * in_quat2.q1 + in_quat1.q3 * in_quat2.w;

    return temp;
}